

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coreTypeOperations.cpp
# Opt level: O0

string_view helics::interfaceTypeName(InterfaceType type)

{
  string_view sVar1;
  InterfaceType type_local;
  size_t local_10;
  char *local_8;
  
  switch(type) {
  case ENDPOINT:
    local_10 = 8;
    local_8 = "Endpoint";
    break;
  case FILTER:
    local_10 = 6;
    local_8 = "Filter";
    break;
  default:
    local_10 = 9;
    local_8 = "Interface";
    break;
  case INPUT:
    local_10 = 5;
    local_8 = "Input";
    break;
  case PUBLICATION:
    local_10 = 0xb;
    local_8 = "Publication";
    break;
  case TRANSLATOR:
    local_10 = 10;
    local_8 = "Translator";
  }
  sVar1._M_str = local_8;
  sVar1._M_len = local_10;
  return sVar1;
}

Assistant:

std::string_view interfaceTypeName(InterfaceType type) noexcept
{
    static constexpr std::string_view pubType{"Publication"};
    static constexpr std::string_view inpType{"Input"};
    static constexpr std::string_view endType{"Endpoint"};
    static constexpr std::string_view transType{"Translator"};
    static constexpr std::string_view filtType{"Filter"};
    static constexpr std::string_view otherType{"Interface"};

    switch (type) {
        case InterfaceType::PUBLICATION:
            return pubType;
        case InterfaceType::ENDPOINT:
            return endType;
        case InterfaceType::INPUT:
            return inpType;
        case InterfaceType::FILTER:
            return filtType;
        case InterfaceType::TRANSLATOR:
            return transType;
        default:
            return otherType;
    }
}